

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_ClassArray<ON_TextureCoordinates>::Remove(ON_ClassArray<ON_TextureCoordinates> *this,int i)

{
  if ((-1 < i) && (i < this->m_count)) {
    ON_SimpleArray<ON_3fPoint>::~ON_SimpleArray(&this->m_a[(uint)i].m_T);
    memset(this->m_a + (uint)i,0,0xb8);
    Move(this,i,i + 1,~i + this->m_count);
    memset(this->m_a + (long)this->m_count + -1,0,0xb8);
    ON_TextureCoordinates::ON_TextureCoordinates(this->m_a + (long)this->m_count + -1);
    this->m_count = this->m_count + -1;
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Remove( int i )
{
  if ( i >= 0 && i < m_count ) 
  {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    Move( i, i+1, m_count-1-i );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[m_count-1]), 0, sizeof(T) );
    ConstructDefaultElement(&m_a[m_count-1]);
    m_count--;
  }
}